

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
StringBuilder<unsigned_long,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2]>
          (unsigned_long *arg,char (*args) [2],char *args_1,char (*args_2) [2],unsigned_long *args_3
          ,char (*args_4) [2],char *args_5,char (*args_6) [2],unsigned_long *args_7,
          char (*args_8) [2],char *args_9,char (*args_10) [2])

{
  char (*in_RCX) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_R8;
  char (*in_R9) [2];
  char *unaff_R14;
  char (*unaff_R15) [2];
  unsigned_long *unaff_retaddr;
  char (*in_stack_00000008) [2];
  char *in_stack_00000010;
  char (*in_stack_00000018) [2];
  unsigned_long *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  string local_88 [32];
  string local_68 [16];
  char (*in_stack_ffffffffffffffa8) [2];
  unsigned_long *in_stack_ffffffffffffffb0;
  
  StringBuilder<unsigned_long>(in_stack_ffffffffffffff28);
  StringBuilder<char[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2]>
            (in_RCX,in_R8,in_R9,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,unaff_R14,
             unaff_R15,unaff_retaddr,in_stack_00000008,in_stack_00000010,in_stack_00000018);
  std::operator+(in_stack_ffffffffffffff68,in_RDI);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_68);
  return in_RDI;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}